

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcAdjacencyInfo.h
# Opt level: O0

O3DGCErrorCode __thiscall
o3dgc::AdjacencyInfo::AllocateNumNeighborsArray(AdjacencyInfo *this,long numElements)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long *plVar3;
  long numElements_local;
  AdjacencyInfo *this_local;
  
  if (this->m_numNeighborsSize < numElements) {
    if (this->m_numNeighbors != (long *)0x0) {
      operator_delete__(this->m_numNeighbors);
    }
    this->m_numNeighborsSize = numElements;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->m_numNeighborsSize;
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    plVar3 = (long *)operator_new__(uVar2);
    this->m_numNeighbors = plVar3;
  }
  this->m_numElements = numElements;
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode          AllocateNumNeighborsArray(long numElements)
                                {
                                    if (numElements > m_numNeighborsSize)
                                    {
                                        delete [] m_numNeighbors;
                                        m_numNeighborsSize = numElements;
                                        m_numNeighbors = new long [m_numNeighborsSize];
                                    }
                                    m_numElements = numElements;
                                    return O3DGC_OK;
                                }